

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O2

void __thiscall
Bstrlib::CBString::findreplacecaseless(CBString *this,CBString *sfind,char *repl,int pos)

{
  int iVar1;
  size_t sVar2;
  CBStringException *pCVar3;
  allocator local_99;
  CBStringException bstr__cppwrapper_exception;
  string local_70;
  string local_50;
  tagbstring t;
  
  if (repl == (char *)0x0) {
    std::__cxx11::string::string
              ((string *)&local_50,"CBString::findreplacecaseless NULL.",&local_99);
    CBStringException::CBStringException(&bstr__cppwrapper_exception,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    pCVar3 = (CBStringException *)__cxa_allocate_exception(0x28);
    CBStringException::CBStringException(pCVar3,&bstr__cppwrapper_exception);
    __cxa_throw(pCVar3,&CBStringException::typeinfo,CBStringException::~CBStringException);
  }
  t.data = (uchar *)repl;
  sVar2 = strlen(repl);
  t.slen = (int)sVar2;
  t.mlen = -1;
  iVar1 = bfindreplacecaseless(&this->super_tagbstring,&sfind->super_tagbstring,&t,pos);
  if (iVar1 != -1) {
    return;
  }
  std::__cxx11::string::string
            ((string *)&local_70,"CBString::Failure in findreplacecaseless",&local_99);
  CBStringException::CBStringException(&bstr__cppwrapper_exception,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  pCVar3 = (CBStringException *)__cxa_allocate_exception(0x28);
  CBStringException::CBStringException(pCVar3,&bstr__cppwrapper_exception);
  __cxa_throw(pCVar3,&CBStringException::typeinfo,CBStringException::~CBStringException);
}

Assistant:

void CBString::findreplacecaseless (const CBString& sfind, const char * repl, int pos) {
struct tagbstring t;
	if (NULL == repl) {
#ifdef BSTRLIB_THROWS_EXCEPTIONS
		bstringThrow ("findreplacecaseless NULL.");
#else
		return;
#endif
	}
	cstr2tbstr (t, repl);
	if (BSTR_ERR == bfindreplacecaseless (this, (bstring) &sfind, (bstring) &t, pos)) {
		bstringThrow ("Failure in findreplacecaseless");
	}
}